

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void class_domainsignalin(_class *c,int onset)

{
  int local_14;
  int onset_local;
  _class *c_local;
  
  if (c != (_class *)0x0) {
    if (onset < 1) {
      local_14 = -1;
    }
    else {
      if (c->c_floatmethod != pd_defaultfloat) {
        post("warning: %s: float method overwritten",c->c_name->s_name);
      }
      c->c_floatmethod = pd_floatforsignal;
      local_14 = onset;
    }
    c->c_floatsignalin = local_14;
  }
  return;
}

Assistant:

void class_domainsignalin(t_class *c, int onset)
{
    if(!c)
        return;
    if (onset <= 0) onset = -1;
    else
    {
        if (c->c_floatmethod != pd_defaultfloat)
            post("warning: %s: float method overwritten", c->c_name->s_name);
        c->c_floatmethod = (t_floatmethod)pd_floatforsignal;
    }
    c->c_floatsignalin = onset;
}